

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O3

void Bac_ManFree(Bac_Man_t *p)

{
  Bac_Ntk_t *pBVar1;
  void *pvVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  if (0 < p->nNtks) {
    lVar4 = 0x198;
    lVar5 = 0;
    do {
      pBVar1 = p->pNtks;
      pvVar2 = *(void **)((long)pBVar1 + lVar4 + -0xa0);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)pBVar1 + lVar4 + -0xa0) = 0;
      }
      *(undefined8 *)((long)pBVar1 + lVar4 + -0xa8) = 0;
      pvVar2 = *(void **)((long)pBVar1 + lVar4 + -0x90);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)pBVar1 + lVar4 + -0x90) = 0;
      }
      *(undefined8 *)((long)pBVar1 + lVar4 + -0x98) = 0;
      pvVar2 = *(void **)((long)pBVar1 + lVar4 + -0x80);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)pBVar1 + lVar4 + -0x80) = 0;
      }
      *(undefined8 *)((long)pBVar1 + lVar4 + -0x88) = 0;
      pvVar2 = *(void **)((long)pBVar1 + lVar4 + -0x70);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)pBVar1 + lVar4 + -0x70) = 0;
      }
      *(undefined8 *)((long)pBVar1 + lVar4 + -0x78) = 0;
      pvVar2 = *(void **)((long)pBVar1 + lVar4 + -0x60);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)pBVar1 + lVar4 + -0x60) = 0;
      }
      *(undefined8 *)((long)pBVar1 + lVar4 + -0x68) = 0;
      pvVar2 = *(void **)((long)pBVar1 + lVar4 + -0x50);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)pBVar1 + lVar4 + -0x50) = 0;
      }
      *(undefined8 *)((long)pBVar1 + lVar4 + -0x58) = 0;
      pvVar2 = *(void **)((long)pBVar1 + lVar4 + -0x40);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)pBVar1 + lVar4 + -0x40) = 0;
      }
      *(undefined8 *)((long)pBVar1 + lVar4 + -0x48) = 0;
      pvVar2 = *(void **)((long)pBVar1 + lVar4 + -0x30);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)pBVar1 + lVar4 + -0x30) = 0;
      }
      *(undefined8 *)((long)pBVar1 + lVar4 + -0x38) = 0;
      pvVar2 = *(void **)((long)pBVar1 + lVar4 + -0x20);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)pBVar1 + lVar4 + -0x20) = 0;
      }
      *(undefined8 *)((long)pBVar1 + lVar4 + -0x28) = 0;
      pvVar2 = *(void **)((long)pBVar1 + lVar4 + -0x10);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)pBVar1 + lVar4 + -0x10) = 0;
      }
      *(undefined8 *)((long)pBVar1 + lVar4 + -0x18) = 0;
      pvVar2 = *(void **)((long)&pBVar1->pDesign + lVar4);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pBVar1->pDesign + lVar4) = 0;
      }
      *(undefined8 *)((long)pBVar1 + lVar4 + -8) = 0;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xd0;
    } while (lVar5 < p->nNtks);
  }
  piVar3 = (p->vBuf2LeafNtk).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vBuf2LeafNtk).pArray = (int *)0x0;
  }
  (p->vBuf2LeafNtk).nCap = 0;
  (p->vBuf2LeafNtk).nSize = 0;
  piVar3 = (p->vBuf2LeafObj).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vBuf2LeafObj).pArray = (int *)0x0;
  }
  (p->vBuf2LeafObj).nCap = 0;
  (p->vBuf2LeafObj).nSize = 0;
  piVar3 = (p->vBuf2RootNtk).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vBuf2RootNtk).pArray = (int *)0x0;
  }
  (p->vBuf2RootNtk).nCap = 0;
  (p->vBuf2RootNtk).nSize = 0;
  piVar3 = (p->vBuf2RootObj).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vBuf2RootObj).pArray = (int *)0x0;
  }
  (p->vBuf2RootObj).nCap = 0;
  (p->vBuf2RootObj).nSize = 0;
  Abc_NamDeref(p->pStrs);
  Abc_NamDeref(p->pMods);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  if (p->pNtks != (Bac_Ntk_t *)0x0) {
    free(p->pNtks);
  }
  free(p);
  return;
}

Assistant:

static inline void Bac_ManFree( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkFree( pNtk );
    Vec_IntErase( &p->vBuf2LeafNtk );
    Vec_IntErase( &p->vBuf2LeafObj );
    Vec_IntErase( &p->vBuf2RootNtk );
    Vec_IntErase( &p->vBuf2RootObj );
    Abc_NamDeref( p->pStrs );
    Abc_NamDeref( p->pMods );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p->pNtks );
    ABC_FREE( p );
}